

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O1

SRes crnlib::LzmaDec_AllocateProbs2(CLzmaDec *p,CLzmaProps *propNew,ISzAlloc *alloc)

{
  UInt16 *pUVar1;
  uint uVar2;
  
  uVar2 = (0x300 << ((char)propNew->lp + (char)propNew->lc & 0x1fU)) + 0x736;
  if ((p->probs == (UInt16 *)0x0) || (uVar2 != p->numProbs)) {
    (*alloc->Free)(alloc,p->probs);
    p->probs = (UInt16 *)0x0;
    pUVar1 = (UInt16 *)(*alloc->Alloc)(alloc,(ulong)uVar2 * 2);
    p->probs = pUVar1;
    p->numProbs = uVar2;
    if (pUVar1 == (UInt16 *)0x0) {
      return 2;
    }
  }
  return 0;
}

Assistant:

static SRes LzmaDec_AllocateProbs2(CLzmaDec* p, const CLzmaProps* propNew, ISzAlloc* alloc) {
  UInt32 numProbs = LzmaProps_GetNumProbs(propNew);
  if (p->probs == 0 || numProbs != p->numProbs) {
    LzmaDec_FreeProbs(p, alloc);
    p->probs = (CLzmaProb*)alloc->Alloc(alloc, numProbs * sizeof(CLzmaProb));
    p->numProbs = numProbs;
    if (p->probs == 0)
      return SZ_ERROR_MEM;
  }
  return SZ_OK;
}